

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<__11,int&>&,__11,int&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [46],
               DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
               *params_1,anon_enum_32 *params_2,int *params_3)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  DebugComparison<(unnamed_enum_at__usr_include_x86_64_linux_gnu_bits_siginfo_consts_h:35:1),_int_&>
  *params_00;
  anon_enum_32 *params_01;
  int *params_02;
  long lVar3;
  ArrayPtr<kj::String> in_stack_ffffffffffffff68;
  undefined8 uStack_88;
  String local_80;
  String local_68;
  String local_50;
  
  str<char_const(&)[46]>
            ((String *)&stack0xffffffffffffff68,(kj *)CONCAT44(in_register_00000014,severity),
             (char (*) [46])CONCAT44(in_register_00000014,severity));
  str<kj::_::DebugComparison<__11,int&>&>(&local_80,(kj *)macroArgs,params_00);
  str<__11&>(&local_68,(kj *)params,params_01);
  str<int&>(&local_50,(kj *)params_1,params_02);
  logInternal((Debug *)
              "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              ,(char *)((ulong)file & 0xffffffff),2,line,&stack0xffffffffffffff68,
              in_stack_ffffffffffffff68);
  lVar3 = 0x48;
  do {
    lVar1 = *(long *)(&stack0xffffffffffffff68 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(&stack0xffffffffffffff70 + lVar3);
      *(undefined8 *)(&stack0xffffffffffffff68 + lVar3) = 0;
      *(undefined8 *)(&stack0xffffffffffffff70 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&uStack_88 + lVar3))
                (*(undefined8 **)((long)&uStack_88 + lVar3),lVar1,1,uVar2,uVar2,0);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}